

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

Value * __thiscall
minja::FilterExpr::do_evaluate(FilterExpr *this,shared_ptr<minja::Context> *context)

{
  bool bVar1;
  __shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2> *this_00;
  runtime_error *this_01;
  long in_RSI;
  Value *in_RDI;
  shared_ptr<minja::Context> *in_stack_00000010;
  ArgumentsExpression *in_stack_00000018;
  ArgumentsValue args_1;
  Value callable;
  ArgumentsValue args;
  Value target;
  CallExpr *ce;
  shared_ptr<minja::Expression> *part;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
  *__range2;
  bool first;
  Value *result;
  vector<minja::Value,_std::allocator<minja::Value>_> *in_stack_fffffffffffffd38;
  iterator in_stack_fffffffffffffd40;
  Value *in_stack_fffffffffffffd58;
  Value *in_stack_fffffffffffffd60;
  ArgumentsValue *in_stack_fffffffffffffda8;
  shared_ptr<minja::Context> *in_stack_fffffffffffffdb0;
  Value *in_stack_fffffffffffffdb8;
  vector<minja::Value,_std::allocator<minja::Value>_> local_210;
  value_type *in_stack_fffffffffffffe08;
  vector<minja::Value,_std::allocator<minja::Value>_> *in_stack_fffffffffffffe10;
  const_iterator in_stack_fffffffffffffe18;
  shared_ptr<minja::Context> *in_stack_ffffffffffffff20;
  Expression *in_stack_ffffffffffffff28;
  __normal_iterator<const_std::shared_ptr<minja::Expression>_*,_std::vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>_>
  local_30;
  long local_28;
  byte local_1a;
  undefined1 local_19;
  
  local_19 = 0;
  Value::Value(in_stack_fffffffffffffd40._M_current);
  local_1a = 1;
  local_28 = in_RSI + 0x20;
  local_30._M_current =
       (shared_ptr<minja::Expression> *)
       std::
       vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
       ::begin((vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
                *)in_stack_fffffffffffffd38);
  std::
  vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>::
  end((vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
       *)in_stack_fffffffffffffd38);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::shared_ptr<minja::Expression>_*,_std::vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>_>
                        *)in_stack_fffffffffffffd40._M_current,
                       (__normal_iterator<const_std::shared_ptr<minja::Expression>_*,_std::vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>_>
                        *)in_stack_fffffffffffffd38);
    if (!bVar1) {
      return in_RDI;
    }
    this_00 = &__gnu_cxx::
               __normal_iterator<const_std::shared_ptr<minja::Expression>_*,_std::vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>_>
               ::operator*(&local_30)->
               super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>;
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this_00);
    if (!bVar1) break;
    if ((local_1a & 1) == 0) {
      in_stack_fffffffffffffd60 =
           (Value *)std::__shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>::get(this_00);
      if (in_stack_fffffffffffffd60 == (Value *)0x0) {
        in_stack_fffffffffffffd58 = (Value *)0x0;
      }
      else {
        in_stack_fffffffffffffd58 =
             (Value *)__dynamic_cast(in_stack_fffffffffffffd60,&Expression::typeinfo,
                                     &CallExpr::typeinfo,0);
      }
      if (in_stack_fffffffffffffd58 == (Value *)0x0) {
        std::__shared_ptr_access<minja::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<minja::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x30ce89);
        Expression::evaluate(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
        in_stack_fffffffffffffd38 = &local_210;
        ArgumentsValue::ArgumentsValue((ArgumentsValue *)in_stack_fffffffffffffd40._M_current);
        std::vector<minja::Value,_std::allocator<minja::Value>_>::begin(in_stack_fffffffffffffd38);
        __gnu_cxx::
        __normal_iterator<minja::Value_const*,std::vector<minja::Value,std::allocator<minja::Value>>>
        ::__normal_iterator<minja::Value*>
                  ((__normal_iterator<const_minja::Value_*,_std::vector<minja::Value,_std::allocator<minja::Value>_>_>
                    *)in_stack_fffffffffffffd40._M_current,
                   (__normal_iterator<minja::Value_*,_std::vector<minja::Value,_std::allocator<minja::Value>_>_>
                    *)in_stack_fffffffffffffd38);
        in_stack_fffffffffffffd40 =
             std::vector<minja::Value,_std::allocator<minja::Value>_>::insert
                       (in_stack_fffffffffffffe10,in_stack_fffffffffffffe18,
                        in_stack_fffffffffffffe08);
        Value::call(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
        Value::operator=(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
        Value::~Value(in_stack_fffffffffffffd40._M_current);
        ArgumentsValue::~ArgumentsValue((ArgumentsValue *)in_stack_fffffffffffffd40._M_current);
        Value::~Value(in_stack_fffffffffffffd40._M_current);
      }
      else {
        std::__shared_ptr_access<minja::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<minja::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x30cd37);
        Expression::evaluate(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
        ArgumentsExpression::evaluate(in_stack_00000018,in_stack_00000010);
        std::vector<minja::Value,_std::allocator<minja::Value>_>::begin(in_stack_fffffffffffffd38);
        __gnu_cxx::
        __normal_iterator<minja::Value_const*,std::vector<minja::Value,std::allocator<minja::Value>>>
        ::__normal_iterator<minja::Value*>
                  ((__normal_iterator<const_minja::Value_*,_std::vector<minja::Value,_std::allocator<minja::Value>_>_>
                    *)in_stack_fffffffffffffd40._M_current,
                   (__normal_iterator<minja::Value_*,_std::vector<minja::Value,_std::allocator<minja::Value>_>_>
                    *)in_stack_fffffffffffffd38);
        std::vector<minja::Value,_std::allocator<minja::Value>_>::insert
                  (in_stack_fffffffffffffe10,in_stack_fffffffffffffe18,in_stack_fffffffffffffe08);
        Value::call(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
        Value::operator=(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
        Value::~Value(in_stack_fffffffffffffd40._M_current);
        ArgumentsValue::~ArgumentsValue((ArgumentsValue *)in_stack_fffffffffffffd40._M_current);
        Value::~Value(in_stack_fffffffffffffd40._M_current);
      }
    }
    else {
      local_1a = 0;
      std::__shared_ptr_access<minja::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<minja::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x30cc88);
      Expression::evaluate(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
      Value::operator=(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
      Value::~Value(in_stack_fffffffffffffd40._M_current);
    }
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<minja::Expression>_*,_std::vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>_>
    ::operator++(&local_30);
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,"FilterExpr.part is null");
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Value do_evaluate(const std::shared_ptr<Context> & context) const override {
        Value result;
        bool first = true;
        for (const auto& part : parts) {
          if (!part) throw std::runtime_error("FilterExpr.part is null");
          if (first) {
            first = false;
            result = part->evaluate(context);
          } else {
            if (auto ce = dynamic_cast<CallExpr*>(part.get())) {
              auto target = ce->object->evaluate(context);
              ArgumentsValue args = ce->args.evaluate(context);
              args.args.insert(args.args.begin(), result);
              result = target.call(context, args);
            } else {
              auto callable = part->evaluate(context);
              ArgumentsValue args;
              args.args.insert(args.args.begin(), result);
              result = callable.call(context, args);
            }
          }
        }
        return result;
    }